

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O1

void __thiscall llvm::Twine::printRepr(Twine *this,raw_ostream *OS)

{
  raw_ostream *prVar1;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  
  Str.Length = 7;
  Str.Data = "(Twine ";
  prVar1 = OS;
  raw_ostream::operator<<(OS,Str);
  printOneChildRepr((Twine *)prVar1,OS,this->LHS,this->LHSKind);
  Str_00.Length = 1;
  Str_00.Data = " ";
  prVar1 = OS;
  raw_ostream::operator<<(OS,Str_00);
  printOneChildRepr((Twine *)prVar1,OS,this->RHS,this->RHSKind);
  Str_01.Length = 1;
  Str_01.Data = ")";
  raw_ostream::operator<<(OS,Str_01);
  return;
}

Assistant:

void Twine::printRepr(raw_ostream &OS) const {
  OS << "(Twine ";
  printOneChildRepr(OS, LHS, getLHSKind());
  OS << " ";
  printOneChildRepr(OS, RHS, getRHSKind());
  OS << ")";
}